

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::display(QLCDNumber *this,QString *s)

{
  long lVar1;
  QLCDNumberPrivate *pQVar2;
  bool *in_RSI;
  long in_FS_OFFSET;
  double v;
  QLCDNumberPrivate *d;
  bool ok;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QLCDNumber *)0x5baeba);
  pQVar2->val = 0.0;
  QString::toDouble(in_RSI);
  QLCDNumberPrivate::internalSetString(d,(QString *)v);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::display(const QString &s)
{
    Q_D(QLCDNumber);
    d->val = 0;
    bool ok = false;
    double v = s.toDouble(&ok);
    if (ok)
        d->val = v;
    d->internalSetString(s);
}